

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::PerVertexValidationTest::getVertexShaderBody
          (string *__return_storage_ptr__,PerVertexValidationTest *this,ContextType context_type,
          _test_iteration iteration,string *main_body)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_208;
  bool local_1f3;
  bool local_1f2;
  bool local_1f1;
  bool local_1d5;
  stringstream local_1c8 [8];
  stringstream vs_body_sstream;
  ostream local_1b8;
  bool local_3e;
  bool local_3d;
  deUint32 local_3c;
  bool include_position;
  ApiType AStack_38;
  bool include_pointsize;
  bool local_32;
  bool local_31;
  bool include_cull_distance;
  string *psStack_30;
  bool include_clip_distance;
  string *main_body_local;
  PerVertexValidationTest *pPStack_20;
  _test_iteration iteration_local;
  PerVertexValidationTest *this_local;
  string *psStack_10;
  ContextType context_type_local;
  
  local_1d5 = false;
  if ((((iteration != TEST_ITERATION_FIRST) &&
       (local_1d5 = false,
       iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE)) &&
      (local_1d5 = false,
      iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE)) &&
     (((local_1d5 = false,
       iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
       (local_1d5 = false,
       iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE)) &&
      (local_1d5 = false,
      iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE)))) {
    local_1d5 = iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE;
  }
  local_31 = local_1d5;
  local_1f1 = false;
  psStack_30 = main_body;
  main_body_local._4_4_ = iteration;
  pPStack_20 = this;
  this_local._4_4_ = context_type.super_ApiType.m_bits;
  psStack_10 = __return_storage_ptr__;
  if (((iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE) &&
      (local_1f1 = false,
      iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE)) &&
     ((local_1f1 = false,
      iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
      ((((local_1f1 = false,
         iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
         (local_1f1 = false,
         iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE)) &&
        (local_1f1 = false,
        iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE)) &&
       (local_1f1 = false,
       iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE)))))) {
    AStack_38 = context_type.super_ApiType.m_bits;
    local_3c = (deUint32)glu::ApiType::core(4,5);
    local_1f1 = glu::contextSupports((ContextType)AStack_38.m_bits,(ApiType)local_3c);
  }
  local_32 = local_1f1;
  local_1f2 = false;
  if (((main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE) &&
      (local_1f2 = false,
      main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE)) &&
     (((local_1f2 = false,
       main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
       ((local_1f2 = false,
        main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
        (local_1f2 = false,
        main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE))))
      && (local_1f2 = false,
         main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE))))
  {
    local_1f2 = main_body_local._4_4_ !=
                TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE;
  }
  local_3d = local_1f2;
  local_1f3 = false;
  if ((((main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE) &&
       (local_1f3 = false,
       main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE)) &&
      (local_1f3 = false,
      main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE)) &&
     (((local_1f3 = false,
       main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE &&
       (local_1f3 = false,
       main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE)) &&
      (local_1f3 = false,
      main_body_local._4_4_ != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE)))) {
    local_1f3 = main_body_local._4_4_ !=
                TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE;
  }
  local_3e = local_1f3;
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar1 = std::operator<<(&local_1b8,"#version ");
  if ((local_32 & 1U) == 0) {
    local_208 = "320";
  }
  else {
    local_208 = "450";
  }
  poVar1 = std::operator<<(poVar1,local_208);
  std::operator<<(poVar1,"\n\nin gl_PerVertex\n{\n");
  pcVar2 = "";
  if ((local_31 & 1U) != 0) {
    pcVar2 = "float gl_ClipDistance[];\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_3d & 1U) != 0) {
    pcVar2 = "float gl_PointSize;\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_3e & 1U) != 0) {
    pcVar2 = "vec4  gl_Position;\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_32 & 1U) != 0) {
    pcVar2 = "float gl_CullDistance[];\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  std::operator<<(&local_1b8,"};\n\nout gl_PerVertex\n{\n");
  pcVar2 = "";
  if ((local_31 & 1U) != 0) {
    pcVar2 = "float gl_ClipDistance[];\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_3d & 1U) != 0) {
    pcVar2 = "float gl_PointSize;\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_3e & 1U) != 0) {
    pcVar2 = "vec4  gl_Position;\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  pcVar2 = "";
  if ((local_32 & 1U) != 0) {
    pcVar2 = "float gl_CullDistance[];\n";
  }
  std::operator<<(&local_1b8,pcVar2);
  poVar1 = std::operator<<(&local_1b8,"};\n\nvoid main()\n{\n    ");
  poVar1 = std::operator<<(poVar1,(string *)main_body);
  std::operator<<(poVar1,"\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getVertexShaderBody(glu::ContextType context_type, _test_iteration iteration,
														 std::string main_body) const
{
	const bool include_clip_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE);
	const bool include_cull_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE &&
										glu::contextSupports(context_type, glu::ApiType::core(4, 5)));
	const bool include_pointsize = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE);
	const bool include_position = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE);
	std::stringstream vs_body_sstream;

	vs_body_sstream << "#version " << ((include_cull_distance) ? "450" : "320") << "\n"
																				   "\n"
																				   "in gl_PerVertex\n"
																				   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "out gl_PerVertex\n"
					   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    "
					<< main_body << "\n"
									"}\n";

	return vs_body_sstream.str();
}